

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O3

void __thiscall vw_ostream::vw_ostream(vw_ostream *this)

{
  undefined1 *this_00;
  
  this_00 = &(this->super_ostream).field_0x88;
  std::ios_base::ios_base((ios_base *)this_00);
  *(undefined8 *)&this->field_0x160 = 0;
  *(undefined2 *)&this->field_0x168 = 0;
  *(undefined8 *)&this->field_0x170 = 0;
  *(undefined8 *)&this->field_0x178 = 0;
  *(undefined8 *)&this->field_0x180 = 0;
  *(undefined8 *)&this->field_0x188 = 0;
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x2cd010;
  *(undefined8 *)&(this->super_ostream).field_0x88 = 0x2cd038;
  std::ios::init((streambuf *)this_00);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x2ccf28;
  *(undefined8 *)&(this->super_ostream).field_0x88 = 0x2ccf50;
  *(code **)&(this->super_ostream).field_0x8 = boost::program_options::detail::cmdline::cmdline;
  *(undefined8 *)&(this->super_ostream).field_0x10 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x18 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x20 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x28 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x30 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x38 = 0;
  std::locale::locale((locale *)&(this->super_ostream).field_0x40);
  *(undefined4 *)&(this->super_ostream).field_0x48 = 0x18;
  *(undefined1 **)&(this->super_ostream).field_0x50 = &(this->super_ostream).field_0x60;
  *(undefined8 *)&(this->super_ostream).field_0x58 = 0;
  (this->super_ostream).field_0x60 = 0;
  *(undefined ***)&(this->super_ostream).field_0x8 = &PTR__stringbuf_002ccf70;
  *(vw_ostream **)&(this->super_ostream).field_0x70 = this;
  *(undefined8 *)&(this->super_ostream).field_0x78 = 0;
  *(code **)&(this->super_ostream).field_0x80 = trace_listener_cerr;
  return;
}

Assistant:

vw_ostream::vw_ostream() : std::ostream(&buf), buf(*this), trace_context(nullptr)
{
  trace_listener = trace_listener_cerr;
}